

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

uint16_t *
ot::commissioner::CommissionerApp::GetJoinerUdpPort
          (CommissionerDataset *aDataset,JoinerType aJoinerType)

{
  JoinerType aJoinerType_local;
  CommissionerDataset *aDataset_local;
  
  if (aJoinerType == kMeshCoP) {
    aDataset->mPresentFlags = aDataset->mPresentFlags | 0x400;
    aDataset_local = (CommissionerDataset *)&aDataset->mJoinerUdpPort;
  }
  else if (aJoinerType == kAE) {
    aDataset->mPresentFlags = aDataset->mPresentFlags | 0x200;
    aDataset_local = (CommissionerDataset *)&aDataset->mAeUdpPort;
  }
  else {
    if (aJoinerType != kNMKP) {
      abort();
    }
    aDataset->mPresentFlags = aDataset->mPresentFlags | 0x100;
    aDataset_local = (CommissionerDataset *)&aDataset->mNmkpUdpPort;
  }
  return &aDataset_local->mBorderAgentLocator;
}

Assistant:

uint16_t &CommissionerApp::GetJoinerUdpPort(CommissionerDataset &aDataset, JoinerType aJoinerType)
{
    switch (aJoinerType)
    {
    case JoinerType::kMeshCoP:
        aDataset.mPresentFlags |= CommissionerDataset::kJoinerUdpPortBit;
        return aDataset.mJoinerUdpPort;

    case JoinerType::kAE:
        aDataset.mPresentFlags |= CommissionerDataset::kAeUdpPortBit;
        return aDataset.mAeUdpPort;

    case JoinerType::kNMKP:
        aDataset.mPresentFlags |= CommissionerDataset::kNmkpUdpPortBit;
        return aDataset.mNmkpUdpPort;

    default:
        VerifyOrDie(false);
        aDataset.mPresentFlags |= CommissionerDataset::kJoinerUdpPortBit;
        return aDataset.mJoinerUdpPort;
    }
}